

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3IdListIndex(IdList *pList,char *zName)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)pList->nId;
  if (pList->nId < 1) {
    uVar2 = uVar3;
  }
  while( true ) {
    if (uVar2 == uVar3) {
      return -1;
    }
    iVar1 = sqlite3StrICmp(pList->a[uVar3].zName,zName);
    if (iVar1 == 0) break;
    uVar3 = uVar3 + 1;
  }
  return (int)uVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3IdListIndex(IdList *pList, const char *zName){
  int i;
  assert( pList!=0 );
  for(i=0; i<pList->nId; i++){
    if( sqlite3StrICmp(pList->a[i].zName, zName)==0 ) return i;
  }
  return -1;
}